

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O1

void __thiscall ProjectWriter::writeQuality(ProjectWriter *this)

{
  pointer ppNVar1;
  Node *pNVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  pointer ppNVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->field_0x18,"\n[QUALITY]\n",0xb);
  ppNVar1 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar6 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar6 != ppNVar1; ppNVar6 = ppNVar6 + 1) {
    pNVar2 = *ppNVar6;
    if (0.0 < pNVar2->initQual) {
      lVar3 = *(long *)&this->field_0x18;
      lVar4 = *(long *)(lVar3 + -0x18);
      *(uint *)(&this->field_0x30 + lVar4) =
           *(uint *)(&this->field_0x30 + lVar4) & 0xffffff4f | 0x20;
      *(undefined8 *)(&this->field_0x28 + *(long *)(lVar3 + -0x18)) = 0x10;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&this->field_0x18,(pNVar2->super_Element).name._M_dataplus._M_p
                          ,(pNVar2->super_Element).name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      lVar3 = *(long *)&this->field_0x18;
      *(undefined8 *)(&this->field_0x28 + *(long *)(lVar3 + -0x18)) = 0xc;
      *(uint *)(&this->field_0x30 + *(long *)(lVar3 + -0x18)) =
           *(uint *)(&this->field_0x30 + *(long *)(lVar3 + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)(&this->field_0x20 + *(long *)(lVar3 + -0x18)) = 4;
      poVar5 = std::ostream::_M_insert<double>(pNVar2->initQual * (this->network->units).factors[8])
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    }
  }
  return;
}

Assistant:

void ProjectWriter::writeQuality()
{
    fout << "\n[QUALITY]\n";
    for (Node* node : network->nodes)
    {
        if (node->initQual > 0.0)
        {
            fout << left << setw(16) << node->name << " ";
            fout << setw(12) << fixed << setprecision(4);
            fout << node->initQual * network->ucf(Units::CONCEN) << "\n";
        }
    }
}